

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::move
          (basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *this,
          basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *other)

{
  uint *puVar1;
  size_t count;
  size_t buf_capacity;
  size_t capacity;
  size_t size;
  uint *data;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *other_local;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *this_local;
  
  puVar1 = detail::buffer<unsigned_int>::data(&other->super_buffer<unsigned_int>);
  count = detail::buffer<unsigned_int>::size(&other->super_buffer<unsigned_int>);
  buf_capacity = detail::buffer<unsigned_int>::capacity(&other->super_buffer<unsigned_int>);
  if (puVar1 == other->store_) {
    detail::buffer<unsigned_int>::set(&this->super_buffer<unsigned_int>,this->store_,buf_capacity);
    puVar1 = detail::make_checked<unsigned_int>(this->store_,buf_capacity);
    std::uninitialized_copy<unsigned_int*,unsigned_int*>(other->store_,other->store_ + count,puVar1)
    ;
  }
  else {
    detail::buffer<unsigned_int>::set(&this->super_buffer<unsigned_int>,puVar1,buf_capacity);
    detail::buffer<unsigned_int>::set(&other->super_buffer<unsigned_int>,other->store_,0);
  }
  resize(this,count);
  return;
}

Assistant:

void move(basic_memory_buffer& other) {
    alloc_ = std::move(other.alloc_);
    T* data = other.data();
    size_t size = other.size(), capacity = other.capacity();
    if (data == other.store_) {
      this->set(store_, capacity);
      std::uninitialized_copy(other.store_, other.store_ + size,
                              detail::make_checked(store_, capacity));
    } else {
      this->set(data, capacity);
      // Set pointer to the inline array so that delete is not called
      // when deallocating.
      other.set(other.store_, 0);
    }
    this->resize(size);
  }